

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq.c
# Opt level: O0

void aq_enqueue_adu(aq_t *q,adu_t *adu)

{
  void *__dest;
  dlist_t *pdVar1;
  dlist_t *dlist;
  adu_t *tmp_adu;
  adu_t *adu_local;
  aq_t *q_local;
  
  if (q == (aq_t *)0x0) {
    __assert_fail("q != NULL","/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",
                  0x55,"void aq_enqueue_adu(aq_t *, adu_t *)");
  }
  if (adu == (adu_t *)0x0) {
    __assert_fail("adu != NULL","/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c"
                  ,0x56,"void aq_enqueue_adu(aq_t *, adu_t *)");
  }
  __dest = malloc(0x5e60);
  if (__dest == (void *)0x0) {
    __assert_fail("tmp_adu != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x59,
                  "void aq_enqueue_adu(aq_t *, adu_t *)");
  }
  memcpy(__dest,adu,0x5e60);
  pdVar1 = dlist_ins_end(&q->adus,__dest);
  if (pdVar1 != (dlist_t *)0x0) {
    return;
  }
  __assert_fail("dlist != NULL","/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c"
                ,0x5e,"void aq_enqueue_adu(aq_t *, adu_t *)");
}

Assistant:

static void aq_enqueue_adu(aq_t *q, adu_t *adu) {
  assert(q   != NULL);
  assert(adu != NULL);

  adu_t *tmp_adu = malloc(sizeof(adu_t));
  assert(tmp_adu != NULL);

  memcpy(tmp_adu, adu, sizeof(adu_t));

  dlist_t *dlist = dlist_ins_end(&q->adus, tmp_adu);
  assert(dlist != NULL);
}